

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# resize.c
# Opt level: O0

void resize_multistep(uint8_t *input,int length,uint8_t *output,int olength,uint8_t *otmp)

{
  int iVar1;
  int iVar2;
  uint uVar3;
  uint8_t *puVar4;
  uint in_ECX;
  uint8_t *in_RDX;
  uint in_ESI;
  uint8_t *in_RDI;
  uint8_t *in_R8;
  uint8_t *unaff_retaddr;
  int in_stack_0000000c;
  uint8_t *in_stack_00000010;
  uint8_t *in;
  int proj_filteredlength;
  int s;
  uint8_t *otmp2;
  int filteredlength;
  uint8_t *out;
  int steps;
  int in_stack_ffffffffffffff8c;
  uint8_t *in_stack_ffffffffffffff90;
  uint8_t *in_stack_ffffffffffffff98;
  uint8_t *in_stack_ffffffffffffffa0;
  uint8_t *input_00;
  uint local_4c;
  uint local_3c;
  uint8_t *local_38;
  
  if (in_ESI == in_ECX) {
    memcpy(in_RDX,in_RDI,(long)(int)in_ESI);
  }
  else {
    iVar1 = get_down2_steps((int)((ulong)in_stack_ffffffffffffff90 >> 0x20),
                            (int)in_stack_ffffffffffffff90);
    if (iVar1 < 1) {
      interpolate(in_stack_ffffffffffffffa0,(int)((ulong)in_stack_ffffffffffffff98 >> 0x20),
                  in_stack_ffffffffffffff90,in_stack_ffffffffffffff8c);
    }
    else {
      local_38 = (uint8_t *)0x0;
      input_00 = in_R8;
      iVar2 = get_down2_length(in_ESI,1);
      puVar4 = input_00 + iVar2;
      local_3c = in_ESI;
      for (local_4c = 0; (int)local_4c < iVar1; local_4c = local_4c + 1) {
        uVar3 = get_down2_length(local_3c,1);
        in_stack_ffffffffffffff98 = local_38;
        if (local_4c == 0) {
          in_stack_ffffffffffffff98 = in_RDI;
        }
        if (((local_4c != iVar1 - 1U) || (local_38 = in_RDX, uVar3 != in_ECX)) &&
           (in_stack_ffffffffffffff90 = in_R8, local_38 = in_R8, (local_4c & 1) != 0)) {
          in_stack_ffffffffffffff90 = puVar4;
          local_38 = puVar4;
        }
        if ((local_3c & 1) == 0) {
          down2_symeven(in_stack_00000010,in_stack_0000000c,unaff_retaddr,
                        (int)((ulong)in_RDI >> 0x20));
        }
        else {
          down2_symodd(in_stack_00000010,in_stack_0000000c,unaff_retaddr);
        }
        local_3c = uVar3;
      }
      if (local_3c != in_ECX) {
        interpolate(input_00,(int)((ulong)in_stack_ffffffffffffff98 >> 0x20),
                    in_stack_ffffffffffffff90,in_stack_ffffffffffffff8c);
      }
    }
  }
  return;
}

Assistant:

static void resize_multistep(const uint8_t *const input, int length,
                             uint8_t *output, int olength, uint8_t *otmp) {
  if (length == olength) {
    memcpy(output, input, sizeof(output[0]) * length);
    return;
  }
  const int steps = get_down2_steps(length, olength);

  if (steps > 0) {
    uint8_t *out = NULL;
    int filteredlength = length;

    assert(otmp != NULL);
    uint8_t *otmp2 = otmp + get_down2_length(length, 1);
    for (int s = 0; s < steps; ++s) {
      const int proj_filteredlength = get_down2_length(filteredlength, 1);
      const uint8_t *const in = (s == 0 ? input : out);
      if (s == steps - 1 && proj_filteredlength == olength)
        out = output;
      else
        out = (s & 1 ? otmp2 : otmp);
      if (filteredlength & 1)
        down2_symodd(in, filteredlength, out);
      else
        down2_symeven(in, filteredlength, out, 0);
      filteredlength = proj_filteredlength;
    }
    if (filteredlength != olength) {
      interpolate(out, filteredlength, output, olength);
    }
  } else {
    interpolate(input, length, output, olength);
  }
}